

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O3

void create_mon_spell_mask(bitflag *f,...)

{
  uint uVar1;
  void **ppvVar2;
  char in_AL;
  void **ppvVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  uint flag;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  mon_spell_info *pmVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  void **local_100;
  void *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  flag_wipe(f,0xd);
  uVar4 = 0x10;
  ppvVar2 = &args[0].overflow_arg_area;
  uVar1 = (uint)local_e0;
  while (uVar1 != 0) {
    flag = 0;
    pmVar6 = mon_spell_types;
    do {
      pmVar6 = pmVar6 + 1;
      if ((pmVar6[-1].type & uVar1) != 0) {
        flag_on_dbg(f,0xd,flag,"f","rs->index");
      }
      flag = (uint)pmVar6->index;
    } while (flag < 0x61);
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar3 = (void **)((long)&local_e8 + uVar5);
      local_100 = ppvVar2;
    }
    else {
      local_100 = ppvVar2 + 1;
      ppvVar3 = ppvVar2;
    }
    ppvVar2 = local_100;
    uVar1 = *(uint *)ppvVar3;
  }
  return;
}

Assistant:

void create_mon_spell_mask(bitflag *f, ...)
{
	const struct mon_spell_info *rs;
	int i;
	va_list args;

	rsf_wipe(f);

	va_start(args, f);

	/* Process each type in the va_args */
    for (i = va_arg(args, int); i != RST_NONE; i = va_arg(args, int)) {
		for (rs = mon_spell_types; rs->index < RSF_MAX; rs++) {
			if (rs->type & i) {
				rsf_on(f, rs->index);
			}
		}
	}

	va_end(args);

	return;
}